

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testChannels.cpp
# Opt level: O0

void anon_unknown.dwarf_47e2f::writeRead
               (Array2D<half> *h1out,Array2D<half> *h2out,char *fileName,int width,int height)

{
  LineOrder LVar1;
  PixelType PVar2;
  bool bVar3;
  ChannelList *fileName_00;
  ChannelList *fileName_01;
  Header *header;
  half *phVar4;
  ostream *poVar5;
  float *pfVar6;
  V2f *this;
  V2f *v;
  LineOrder *pLVar7;
  Compression *pCVar8;
  char *__s1;
  char *__s2;
  Channel *pCVar9;
  int in_ECX;
  char *in_RDX;
  Array2D<half> *in_RSI;
  Array2D<half> *in_RDI;
  undefined4 in_R8D;
  float fVar10;
  float fVar11;
  FrameBuffer *in_stack_00000098;
  OutputFile *in_stack_000000a0;
  int x;
  int y;
  ConstIterator ii;
  ConstIterator hi;
  FrameBuffer fb_1;
  Array2D<half> h4in;
  Array2D<half> h3in;
  Array2D<half> h1in;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  InputFile in;
  OutputFile out;
  FrameBuffer fb;
  Header hdr;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffaec;
  Header *in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  undefined8 in_stack_fffffffffffffb18;
  Compression CVar15;
  OutputFile *in_stack_fffffffffffffb20;
  V2f *in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb34;
  undefined8 in_stack_fffffffffffffb38;
  Header *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffd30;
  int iVar16;
  undefined4 in_stack_fffffffffffffd34;
  int iVar17;
  Slice *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  OutputFile *in_stack_fffffffffffffd90;
  FrameBuffer *in_stack_fffffffffffffd98;
  InputFile *in_stack_fffffffffffffda0;
  Slice local_228;
  Array2D<half> local_1c0;
  Array2D<half> local_1a8;
  Array2D<half> local_190;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  Box2i *local_168;
  InputFile local_160 [2];
  Slice local_140;
  Slice local_108;
  Channel local_9c;
  Channel local_8c;
  Channel local_7c;
  Vec2<float> local_60;
  undefined1 local_58 [60];
  int local_1c;
  char *local_18;
  Array2D<half> *local_10;
  Array2D<half> *local_8;
  
  CVar15 = (Compression)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_2_5::Vec2<float>::Vec2(&local_60,0.0,0.0);
  iVar17 = (int)((ulong)local_58 >> 0x20);
  Imf_2_5::Header::Header
            (in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
             (int)in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,in_stack_fffffffffffffb28,
             (float)((ulong)in_stack_fffffffffffffb20 >> 0x20),(LineOrder)in_stack_fffffffffffffb20,
             CVar15);
  fileName_00 = Imf_2_5::Header::channels((Header *)0x13ce11);
  Imf_2_5::Channel::Channel(&local_7c,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (Channel *)in_stack_fffffffffffffd80);
  fileName_01 = Imf_2_5::Header::channels((Header *)0x13ce61);
  Imf_2_5::Channel::Channel(&local_8c,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (Channel *)in_stack_fffffffffffffd80);
  header = (Header *)Imf_2_5::Header::channels((Header *)0x13ceb1);
  Imf_2_5::Channel::Channel(&local_9c,HALF,1,1,false);
  Imf_2_5::ChannelList::insert
            ((ChannelList *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (Channel *)in_stack_fffffffffffffd80);
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x13cf01);
  phVar4 = Imf_2_5::Array2D<half>::operator[](local_8,0);
  Imf_2_5::Slice::Slice(&local_108,HALF,(char *)phVar4,2,(long)local_1c * 2,1,1,0.0,false,false);
  iVar16 = (int)((ulong)phVar4 >> 0x20);
  Imf_2_5::FrameBuffer::insert
            ((FrameBuffer *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  phVar4 = Imf_2_5::Array2D<half>::operator[](local_10,0);
  uVar13 = 0;
  uVar12 = 0;
  Imf_2_5::Slice::Slice(&local_140,HALF,(char *)phVar4,2,(long)local_1c * 2,1,1,0.0,false,false);
  Imf_2_5::FrameBuffer::insert
            ((FrameBuffer *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  poVar5 = std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  remove(local_18);
  Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile
            ((OutputFile *)CONCAT44(in_R8D,in_ECX),(char *)fileName_01,header,iVar16);
  Imf_2_5::OutputFile::setFrameBuffer(in_stack_000000a0,in_stack_00000098);
  Imf_2_5::OutputFile::writePixels(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
  Imf_2_5::OutputFile::~OutputFile(in_stack_fffffffffffffb20);
  Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x13d0d2);
  poVar5 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile
            ((InputFile *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             (char *)fileName_00,iVar17);
  Imf_2_5::InputFile::header(local_160);
  local_168 = Imf_2_5::Header::dataWindow((Header *)0x13d165);
  local_16c = ((local_168->max).x - (local_168->min).x) + 1;
  local_170 = ((local_168->max).y - (local_168->min).y) + 1;
  local_174 = (local_168->min).x;
  local_178 = (local_168->min).y;
  Imf_2_5::Array2D<half>::Array2D
            ((Array2D<half> *)in_stack_fffffffffffffaf0,CONCAT44(in_stack_fffffffffffffaec,uVar13),
             CONCAT44(in_stack_fffffffffffffae4,uVar12));
  Imf_2_5::Array2D<half>::Array2D
            ((Array2D<half> *)in_stack_fffffffffffffaf0,CONCAT44(in_stack_fffffffffffffaec,uVar13),
             CONCAT44(in_stack_fffffffffffffae4,uVar12));
  Imf_2_5::Array2D<half>::Array2D
            ((Array2D<half> *)in_stack_fffffffffffffaf0,CONCAT44(in_stack_fffffffffffffaec,uVar13),
             CONCAT44(in_stack_fffffffffffffae4,uVar12));
  Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x13d23d);
  phVar4 = Imf_2_5::Array2D<half>::operator[](&local_190,(long)-local_178);
  Imf_2_5::Slice::Slice
            (&local_228,HALF,(char *)(phVar4 + -local_174),2,(long)local_16c * 2,1,1,3.0,false,false
            );
  Imf_2_5::FrameBuffer::insert
            ((FrameBuffer *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  phVar4 = Imf_2_5::Array2D<half>::operator[](&local_1a8,(long)-local_178);
  Imf_2_5::Slice::Slice
            ((Slice *)&stack0xfffffffffffffda0,HALF,(char *)(phVar4 + -local_174),2,
             (long)local_16c * 2,1,1,3.0,false,false);
  Imf_2_5::FrameBuffer::insert
            ((FrameBuffer *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  phVar4 = Imf_2_5::Array2D<half>::operator[](&local_1c0,(long)-local_178);
  uVar14 = 0;
  uVar13 = 0;
  uVar12 = 1;
  Imf_2_5::Slice::Slice
            ((Slice *)&stack0xfffffffffffffd68,HALF,(char *)(phVar4 + -local_174),2,
             (long)local_16c * 2,1,1,3.0,false,false);
  Imf_2_5::FrameBuffer::insert
            ((FrameBuffer *)in_stack_fffffffffffffd90,
             (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80);
  Imf_2_5::InputFile::setFrameBuffer(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  Imf_2_5::InputFile::readPixels
            ((InputFile *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8);
  poVar5 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_2_5::InputFile::header(local_160);
  Imf_2_5::Header::displayWindow((Header *)0x13d472);
  Imf_2_5::Header::displayWindow((Header *)0x13d489);
  bVar3 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffaf0,
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffaec,uVar14));
  if (!bVar3) {
    __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                  ,0xc2,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_2_5::InputFile::header(local_160);
  Imf_2_5::Header::dataWindow((Header *)0x13d5e6);
  Imf_2_5::Header::dataWindow((Header *)0x13d5fd);
  bVar3 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffaf0,
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffaec,uVar14));
  if (!bVar3) {
    __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                  ,0xc3,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_2_5::InputFile::header(local_160);
  pfVar6 = Imf_2_5::Header::pixelAspectRatio((Header *)0x13d677);
  fVar10 = *pfVar6;
  pfVar6 = Imf_2_5::Header::pixelAspectRatio((Header *)0x13d6a3);
  if ((fVar10 != *pfVar6) || (NAN(fVar10) || NAN(*pfVar6))) {
    __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                  ,0xc4,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_2_5::InputFile::header(local_160);
  this = Imf_2_5::Header::screenWindowCenter((Header *)0x13d70a);
  v = Imf_2_5::Header::screenWindowCenter((Header *)0x13d721);
  bVar3 = Imath_2_5::Vec2<float>::operator==(this,v);
  if (!bVar3) {
    __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                  ,0xc5,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_2_5::InputFile::header(local_160);
  pfVar6 = Imf_2_5::Header::screenWindowWidth((Header *)0x13d79b);
  fVar10 = *pfVar6;
  pfVar6 = Imf_2_5::Header::screenWindowWidth((Header *)0x13d7c7);
  if ((fVar10 == *pfVar6) && (!NAN(fVar10) && !NAN(*pfVar6))) {
    Imf_2_5::InputFile::header(local_160);
    pLVar7 = Imf_2_5::Header::lineOrder((Header *)0x13d82e);
    LVar1 = *pLVar7;
    pLVar7 = Imf_2_5::Header::lineOrder((Header *)0x13d856);
    if (LVar1 != *pLVar7) {
      __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                    ,199,
                    "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                   );
    }
    Imf_2_5::InputFile::header(local_160);
    pCVar8 = Imf_2_5::Header::compression((Header *)0x13d8b8);
    CVar15 = *pCVar8;
    pCVar8 = Imf_2_5::Header::compression((Header *)0x13d8e0);
    if (CVar15 != *pCVar8) {
      __assert_fail("in.header().compression() == hdr.compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                    ,200,
                    "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                   );
    }
    Imf_2_5::Header::channels((Header *)0x13d92b);
    Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
    Imf_2_5::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffae4,uVar13),
               (Iterator *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
    Imf_2_5::InputFile::header(local_160);
    Imf_2_5::Header::channels((Header *)0x13d997);
    Imf_2_5::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
    while( true ) {
      Imf_2_5::Header::channels((Header *)0x13d9d5);
      Imf_2_5::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
      Imf_2_5::ChannelList::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffae4,uVar13),
                 (Iterator *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
      bVar3 = Imf_2_5::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffae4,uVar13),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
      if (!bVar3) {
        Imf_2_5::InputFile::header(local_160);
        Imf_2_5::Header::channels((Header *)0x13dc3d);
        Imf_2_5::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
        bVar3 = Imf_2_5::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffffae4,uVar13),
                                    (ConstIterator *)CONCAT44(in_stack_fffffffffffffadc,uVar12));
        if (!bVar3) {
          __assert_fail("ii == in.header().channels().end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                        ,0xd8,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                       );
        }
        iVar17 = 0;
        do {
          if (local_170 <= iVar17) {
            Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x13de8c);
            Imf_2_5::Array2D<half>::~Array2D
                      ((Array2D<half> *)CONCAT44(in_stack_fffffffffffffae4,uVar13));
            Imf_2_5::Array2D<half>::~Array2D
                      ((Array2D<half> *)CONCAT44(in_stack_fffffffffffffae4,uVar13));
            Imf_2_5::Array2D<half>::~Array2D
                      ((Array2D<half> *)CONCAT44(in_stack_fffffffffffffae4,uVar13));
            Imf_2_5::InputFile::~InputFile((InputFile *)in_stack_fffffffffffffaf0);
            remove(local_18);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            Imf_2_5::Header::~Header(in_stack_fffffffffffffaf0);
            return;
          }
          for (iVar16 = 0; iVar16 < local_16c; iVar16 = iVar16 + 1) {
            phVar4 = Imf_2_5::Array2D<half>::operator[](&local_190,(long)iVar17);
            fVar10 = half::operator_cast_to_float(phVar4 + iVar16);
            phVar4 = Imf_2_5::Array2D<half>::operator[](local_8,(long)iVar17);
            fVar11 = half::operator_cast_to_float(phVar4 + iVar16);
            if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
              __assert_fail("h1in[y][x] == h1out[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                            ,0xde,
                            "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                           );
            }
            phVar4 = Imf_2_5::Array2D<half>::operator[](&local_1a8,(long)iVar17);
            fVar10 = half::operator_cast_to_float(phVar4 + iVar16);
            if ((fVar10 != 0.0) || (NAN(fVar10))) {
              __assert_fail("h3in[y][x] == 0.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                            ,0xdf,
                            "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                           );
            }
            phVar4 = Imf_2_5::Array2D<half>::operator[](&local_1c0,(long)iVar17);
            fVar10 = half::operator_cast_to_float(phVar4 + iVar16);
            if ((fVar10 != 3.0) || (NAN(fVar10))) {
              __assert_fail("h4in[y][x] == 3.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                            ,0xe0,
                            "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                           );
            }
          }
          iVar17 = iVar17 + 1;
        } while( true );
      }
      __s1 = Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x13da58);
      __s2 = Imf_2_5::ChannelList::ConstIterator::name((ConstIterator *)0x13da6f);
      iVar17 = strcmp(__s1,__s2);
      if (iVar17 != 0) {
        __assert_fail("!strcmp (hi.name(), ii.name())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                      ,0xcf,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                     );
      }
      pCVar9 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x13daca);
      PVar2 = pCVar9->type;
      pCVar9 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x13daf2);
      if (PVar2 != pCVar9->type) {
        __assert_fail("hi.channel().type == ii.channel().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                      ,0xd0,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                     );
      }
      pCVar9 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x13db3d);
      iVar17 = pCVar9->xSampling;
      pCVar9 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x13db63);
      if (iVar17 != pCVar9->xSampling) {
        __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                      ,0xd1,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                     );
      }
      pCVar9 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x13dba6);
      iVar17 = pCVar9->ySampling;
      pCVar9 = Imf_2_5::ChannelList::ConstIterator::channel((ConstIterator *)0x13dbc6);
      if (iVar17 != pCVar9->ySampling) break;
      Imf_2_5::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffae4,uVar13));
      Imf_2_5::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffae4,uVar13));
    }
    __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                  ,0xd2,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testChannels.cpp"
                ,0xc6,
                "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
               );
}

Assistant:

void
writeRead (const Array2D<half> &h1out,
	   const Array2D<half> &h2out,
	   const char fileName[],
	   int width,
	   int height)
{
    //
    // Write an image file with three channels, H1, H2 and H3.
    // Our frame buffer contains pixel data only for H1 and H2;
    // the file's H3 channel should be filled with zeroes.
    //

    Header hdr (width, height);

    hdr.channels().insert ("H1",			// name
			   Channel (HALF,		// type
				    1,			// xSampling
				    1)			// ySampling
			  );

    hdr.channels().insert ("H2",			// name
			   Channel (HALF,		// type
				    1,			// xSampling
				    1)			// ySampling
			  );

    hdr.channels().insert ("H3",			// name
			   Channel (HALF,		// type
				    1,			// xSampling
				    1)			// ySampling
			  );

    {
	FrameBuffer fb; 

	fb.insert ("H1",				// name
		   Slice (HALF,				// type
			  (char *) &h1out[0][0],	// base
			  sizeof (h1out[0][0]), 	// xStride
			  sizeof (h1out[0][0]) * width,	// yStride
			  1,				// xSampling
			  1)				// ySampling
		  );

	fb.insert ("H2",				// name
		   Slice (HALF,				// type
			  (char *) &h2out[0][0],	// base
			  sizeof (h2out[0][0]), 	// xStride
			  sizeof (h2out[0][0]) * width,	// yStride
			  1,				// xSampling
			  1)				// ySampling
		  );
	
	cout << "writing" << flush;

	remove (fileName);
	OutputFile out (fileName, hdr);
	out.setFrameBuffer (fb);
	out.writePixels (height);
    }

    //
    // Read the image back from the file.  Our frame buffer now
    // contains space for the three channels, H1, H3 and H4.
    // H1 and H3 should be read back from the file (but H3
    // should contain only zeroes), and H4 should be filled
    // with a default value, 3.0, because the file contains
    // no data for it.  The file's H2 channel should be ignored.
    //

    {
	cout << " reading" << flush;

	InputFile in (fileName);
	
	const Box2i &dw = in.header().dataWindow();
	int w = dw.max.x - dw.min.x + 1;
	int h = dw.max.y - dw.min.y + 1;
	int dx = dw.min.x;
	int dy = dw.min.y;

	Array2D<half> h1in (h, w);
	Array2D<half> h3in (h, w);
	Array2D<half> h4in (h, w);

	FrameBuffer fb;

	fb.insert ("H1",				// name
		   Slice (HALF,				// type
			  (char *) &h1in[-dy][-dx],	// base
			  sizeof (h1in[0][0]), 		// xStride
			  sizeof (h1in[0][0]) * w,	// yStride
			  1,				// xSampling
			  1,				// ySampling
			  3.0)				// fillValue
		  );
	    
	fb.insert ("H3",				// name
		   Slice (HALF,				// type
			  (char *) &h3in[-dy][-dx],	// base
			  sizeof (h3in[0][0]), 		// xStride
			  sizeof (h3in[0][0]) * w,	// yStride
			  1,				// xSampling
			  1,				// ySampling
			  3.0)				// fillValue
		  );
	    
	fb.insert ("H4",				// name
		   Slice (HALF,				// type
			  (char *) &h4in[-dy][-dx],	// base
			  sizeof (h4in[0][0]), 		// xStride
			  sizeof (h4in[0][0]) * w,	// yStride
			  1,				// xSampling
			  1,				// ySampling
			  3.0)				// fillValue
		  );
	    
	in.setFrameBuffer (fb);
	in.readPixels (dw.min.y, dw.max.y);

	cout << " comparing" << flush;

	assert (in.header().displayWindow() == hdr.displayWindow());
	assert (in.header().dataWindow() == hdr.dataWindow());
	assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
	assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
	assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
	assert (in.header().lineOrder() == hdr.lineOrder());
	assert (in.header().compression() == hdr.compression());

	ChannelList::ConstIterator hi = hdr.channels().begin();
	ChannelList::ConstIterator ii = in.header().channels().begin();

	while (hi != hdr.channels().end())
	{
	    assert (!strcmp (hi.name(), ii.name()));
	    assert (hi.channel().type == ii.channel().type);
	    assert (hi.channel().xSampling == ii.channel().xSampling);
	    assert (hi.channel().ySampling == ii.channel().ySampling);

	    ++hi;
	    ++ii;
	}

	assert (ii == in.header().channels().end());

	for (int y = 0; y < h; ++y)
	{
	    for (int x = 0; x < w; ++x)
	    {
		assert (h1in[y][x] == h1out[y][x]);
		assert (h3in[y][x] == 0.0);
		assert (h4in[y][x] == 3.0);
	    }
	}
    }

    remove (fileName);
    cout << endl;
}